

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Type *this;
  WaitOrderStatementSyntax *this_00;
  bool bVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  undefined4 extraout_var_00;
  ActionBlockSyntax *pAVar5;
  StatementSyntax *pSVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WaitOrderStatement *pWVar7;
  ASTContext *extraout_RDX;
  ASTContext *src;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  char *func;
  size_t index;
  ulong uVar8;
  SourceRange SVar9;
  Statement *ifFalse;
  Statement *ifTrue;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_b0;
  StatementContext *local_a0;
  WaitOrderStatementSyntax *local_98;
  Statement *local_90;
  Statement *local_88;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  SourceRange local_40;
  Expression *this_01;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  uVar8 = (syntax->names).elements.size_ + 1;
  src = context;
  local_a0 = stmtCtx;
  local_98 = syntax;
  if (1 < uVar8) {
    index = 0;
    do {
      pSVar3 = (SyntaxNode *)
               slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::operator[]
                         (&syntax->names,index);
      iVar2 = Expression::bind((int)pSVar3,(sockaddr *)context,0);
      this_01 = (Expression *)CONCAT44(extraout_var,iVar2);
      bVar1 = Expression::bad(this_01);
      if (bVar1) {
        local_b0.data_ = (pointer)0x0;
        pWVar7 = (WaitOrderStatement *)
                 BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                           (&compilation->super_BumpAllocator,(Statement **)&local_b0);
        goto LAB_0028fae8;
      }
      this = (this_01->type).ptr;
      if (this == (Type *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                  );
      }
      pTVar4 = this->canonical;
      if (pTVar4 == (Type *)0x0) {
        Type::resolveCanonical(this);
        pTVar4 = this->canonical;
      }
      if ((pTVar4->super_Symbol).kind != EventType) {
        SVar9 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
        ASTContext::addDiag(context,(DiagCode)0x2c0008,SVar9);
        local_b0.data_ = (pointer)0x0;
        pWVar7 = (WaitOrderStatement *)
                 BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                           (&compilation->super_BumpAllocator,(Statement **)&local_b0);
        goto LAB_0028fae8;
      }
      local_b0.data_ = (pointer)this_01;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_80,(Expression **)&local_b0
                );
      index = index + 1;
      src = extraout_RDX;
    } while (uVar8 >> 1 != index);
  }
  this_00 = local_98;
  local_88 = (Statement *)0x0;
  local_90 = (Statement *)0x0;
  pAVar5 = (local_98->action).ptr;
  func = 
  "T slang::not_null<slang::syntax::ActionBlockSyntax *>::get() const [T = slang::syntax::ActionBlockSyntax *]"
  ;
  if (pAVar5 != (ActionBlockSyntax *)0x0) {
    if (pAVar5->statement != (StatementSyntax *)0x0) {
      iVar2 = Statement::bind((int)pAVar5->statement,(sockaddr *)context,(socklen_t)local_a0);
      local_88 = (Statement *)CONCAT44(extraout_var_00,iVar2);
      pAVar5 = (this_00->action).ptr;
      src = extraout_RDX_00;
      if (pAVar5 == (ActionBlockSyntax *)0x0) goto LAB_0028fb37;
    }
    if (pAVar5->elseClause != (ElseClauseSyntax *)0x0) {
      pSVar3 = (pAVar5->elseClause->clause).ptr;
      if (pSVar3 == (SyntaxNode *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::SyntaxNode *>::get() const [T = slang::syntax::SyntaxNode *]"
        ;
        goto LAB_0028fb37;
      }
      pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(pSVar3);
      iVar2 = Statement::bind((int)pSVar6,(sockaddr *)context,(socklen_t)local_a0);
      local_90 = (Statement *)CONCAT44(extraout_var_01,iVar2);
      src = extraout_RDX_01;
    }
    iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_80,(EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
    local_b0.data_ = (pointer)CONCAT44(extraout_var_02,iVar2);
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    pWVar7 = BumpAllocator::
             emplace<slang::ast::WaitOrderStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,&local_b0,&local_88,&local_90,&local_40);
    if ((((context->flags).m_bits & 0x6000) != 0) ||
       (bVar1 = ASTContext::inAlwaysCombLatch(context), bVar1)) {
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
      ASTContext::addDiag(context,(DiagCode)0x460008,SVar9);
      local_b0.data_ = (pointer)pWVar7;
      pWVar7 = (WaitOrderStatement *)
               BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&compilation->super_BumpAllocator,(Statement **)&local_b0);
    }
LAB_0028fae8:
    if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
      free(local_80[0].data_);
    }
    return &pWVar7->super_Statement;
  }
LAB_0028fb37:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());
    if (context.flags.has(ASTFlags::Function) || context.flags.has(ASTFlags::Final) ||
        context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}